

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_trimwhite(char *s)

{
  byte *pbVar1;
  ushort *puVar2;
  uint uVar3;
  uint uVar4;
  ushort **ppuVar5;
  size_t sVar6;
  uint uVar7;
  char *pcVar8;
  char *__s;
  
  ppuVar5 = __ctype_b_loc();
  puVar2 = *ppuVar5;
  __s = s + -1;
  do {
    pbVar1 = (byte *)(__s + 1);
    __s = __s + 1;
  } while ((*(byte *)((long)puVar2 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  sVar6 = strlen(__s);
  uVar3 = (uint)sVar6;
  pcVar8 = __s + (sVar6 & 0xffffffff);
  do {
    pcVar8 = pcVar8 + -1;
    uVar4 = (uint)sVar6;
    uVar7 = (int)uVar3 >> 0x1f & uVar3;
    if ((int)uVar4 < 1) break;
    sVar6 = (size_t)(uVar4 - 1);
    uVar7 = uVar4;
  } while ((*(byte *)((long)puVar2 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
  __s[(int)uVar7] = '\0';
  return __s;
}

Assistant:

char *stb_trimwhite(char *s)
{
   int i,n;
   s = stb_skipwhite(s);
   n = (int) strlen(s);
   for (i=n-1; i >= 0; --i)
      if (!isspace(s[i]))
         break;
   s[i+1] = 0;
   return s;
}